

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::removeAnchor
          (QGraphicsAnchorLayoutPrivate *this,AnchorVertex *firstVertex,AnchorVertex *secondVertex)

{
  long *plVar1;
  QGraphicsLayoutItem *pQVar2;
  QGraphicsLayoutItem *pQVar3;
  QGraphicsLayoutItem *pQVar4;
  Data *pDVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *pNVar9;
  long lVar10;
  int i;
  AnchorPoint AVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  pQVar3 = firstVertex->m_item;
  pQVar4 = secondVertex->m_item;
  removeAnchor_helper(this,firstVertex,secondVertex);
  bVar8 = true;
  if (pQVar3 != pQVar2) {
    AVar11 = AnchorLeft;
    do {
      pDVar5 = (this->m_vertexList).d;
      local_48.first = pQVar3;
      local_48.second = AVar11;
      if ((((pDVar5 != (Data *)0x0) &&
           (pNVar9 = QHashPrivate::
                     Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                     ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                               ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                                 *)pDVar5,&local_48),
           pNVar9 != (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                      *)0x0)) && ((pNVar9->value).first != (AnchorVertex *)0x0)) &&
         ((int)((AVar11 == AnchorHorizontalCenter || AVar11 == AnchorVerticalCenter) + 1) <
          (pNVar9->value).second)) {
        bVar8 = true;
        goto LAB_005bc445;
      }
      AVar11 = AVar11 + AnchorHorizontalCenter;
    } while (AVar11 != (AnchorVerticalCenter|AnchorRight));
    bVar8 = false;
  }
LAB_005bc445:
  bVar7 = true;
  if (pQVar4 != pQVar2) {
    AVar11 = AnchorLeft;
    do {
      pDVar5 = (this->m_vertexList).d;
      local_48.first = pQVar4;
      local_48.second = AVar11;
      if (((pDVar5 != (Data *)0x0) &&
          (pNVar9 = QHashPrivate::
                    Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                    ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                              ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                                *)pDVar5,&local_48),
          pNVar9 != (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                     *)0x0)) &&
         (((pNVar9->value).first != (AnchorVertex *)0x0 &&
          ((int)((AVar11 == AnchorHorizontalCenter || AVar11 == AnchorVerticalCenter) + 1) <
           (pNVar9->value).second)))) {
        bVar7 = true;
        goto LAB_005bc4a7;
      }
      AVar11 = AVar11 + AnchorHorizontalCenter;
    } while (AVar11 != (AnchorVerticalCenter|AnchorRight));
    bVar7 = false;
  }
LAB_005bc4a7:
  if (!bVar8) {
    lVar6 = (this->items).d.size;
    if (lVar6 == 0) {
LAB_005bc4df:
      uVar12 = 0xffffffff;
    }
    else {
      uVar12 = 0xffffffff;
      lVar10 = 0;
      do {
        if (lVar6 << 3 == lVar10) goto LAB_005bc4df;
        uVar12 = (ulong)((int)uVar12 + 1);
        plVar1 = (long *)((long)(this->items).d.ptr + lVar10);
        lVar10 = lVar10 + 8;
      } while ((QGraphicsLayoutItem *)*plVar1 != pQVar3);
    }
    (*pQVar2->_vptr_QGraphicsLayoutItem[0xb])(pQVar2,uVar12);
  }
  if (!bVar7) {
    lVar6 = (this->items).d.size;
    if (lVar6 == 0) {
LAB_005bc526:
      uVar12 = 0xffffffff;
    }
    else {
      uVar12 = 0xffffffff;
      lVar10 = 0;
      do {
        if (lVar6 << 3 == lVar10) goto LAB_005bc526;
        uVar12 = (ulong)((int)uVar12 + 1);
        plVar1 = (long *)((long)(this->items).d.ptr + lVar10);
        lVar10 = lVar10 + 8;
      } while ((QGraphicsLayoutItem *)*plVar1 != pQVar4);
    }
    (*pQVar2->_vptr_QGraphicsLayoutItem[0xb])(pQVar2,uVar12);
  }
  (*pQVar2->_vptr_QGraphicsLayoutItem[7])(pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeAnchor(AnchorVertex *firstVertex,
                                                AnchorVertex *secondVertex)
{
    Q_Q(QGraphicsAnchorLayout);

    // Save references to items while it's safe to assume the vertices exist
    QGraphicsLayoutItem *firstItem = firstVertex->m_item;
    QGraphicsLayoutItem *secondItem = secondVertex->m_item;

    // Delete the anchor (may trigger deletion of center vertices)
    removeAnchor_helper(firstVertex, secondVertex);

    // Ensure no dangling pointer is left behind
    firstVertex = secondVertex = nullptr;

    // Checking if the item stays in the layout or not
    bool keepFirstItem = false;
    bool keepSecondItem = false;

    std::pair<AnchorVertex *, int> v;
    int refcount = -1;

    if (firstItem != q) {
        for (int i = Qt::AnchorLeft; i <= Qt::AnchorBottom; ++i) {
            v = m_vertexList.value(std::pair(firstItem, static_cast<Qt::AnchorPoint>(i)));
            if (v.first) {
                if (i == Qt::AnchorHorizontalCenter || i == Qt::AnchorVerticalCenter)
                    refcount = 2;
                else
                    refcount = 1;

                if (v.second > refcount) {
                    keepFirstItem = true;
                    break;
                }
            }
        }
    } else
        keepFirstItem = true;

    if (secondItem != q) {
        for (int i = Qt::AnchorLeft; i <= Qt::AnchorBottom; ++i) {
            v = m_vertexList.value(std::pair(secondItem, static_cast<Qt::AnchorPoint>(i)));
            if (v.first) {
                if (i == Qt::AnchorHorizontalCenter || i == Qt::AnchorVerticalCenter)
                    refcount = 2;
                else
                    refcount = 1;

                if (v.second > refcount) {
                    keepSecondItem = true;
                    break;
                }
            }
        }
    } else
        keepSecondItem = true;

    if (!keepFirstItem)
        q->removeAt(items.indexOf(firstItem));

    if (!keepSecondItem)
        q->removeAt(items.indexOf(secondItem));

    // Removing anchors invalidates the layout
    q->invalidate();
}